

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManComputeSolutions(Emb_Man_t *p,int nDims,int nSols)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  Emb_Dat_t *pEVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (p->pSols == (float *)0x0) {
    uVar1 = p->nObjs;
    pfVar3 = (float *)calloc((long)(int)(uVar1 * nSols),4);
    p->pSols = pfVar3;
    if (0 < nDims) {
      pEVar4 = p->pVecs;
      uVar5 = 0;
      do {
        if (0 < nSols) {
          uVar7 = 0;
          pfVar6 = pfVar3;
          do {
            if (0 < (int)uVar1) {
              pfVar2 = p->pEigen[uVar7];
              uVar8 = 0;
              do {
                pfVar6[uVar8] = pEVar4[uVar8] * pfVar2[uVar5] + pfVar6[uVar8];
                uVar8 = uVar8 + 1;
              } while (uVar1 != uVar8);
            }
            uVar7 = uVar7 + 1;
            pfVar6 = pfVar6 + (int)uVar1;
          } while (uVar7 != (uint)nSols);
        }
        uVar5 = uVar5 + 1;
        pEVar4 = pEVar4 + (int)uVar1;
      } while (uVar5 != (uint)nDims);
    }
    return;
  }
  __assert_fail("p->pSols == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                ,0x57a,"void Emb_ManComputeSolutions(Emb_Man_t *, int, int)");
}

Assistant:

void Emb_ManComputeSolutions( Emb_Man_t * p, int nDims, int nSols )
{
    Emb_Dat_t * pX;
    float * pY;
    int i, j, k;
    assert( p->pSols == NULL );
    p->pSols = ABC_CALLOC( float, p->nObjs * nSols );
    for ( i = 0; i < nDims; i++ )
    {
        pX = Emb_ManVec( p, i );
        for ( j = 0; j < nSols; j++ )
        {
            pY = Emb_ManSol( p, j );
            for ( k = 0; k < p->nObjs; k++ )
                pY[k] += pX[k] * p->pEigen[j][i];
        }
    }
}